

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_ValidateProto3Extension_Test::TestBody
          (ValidationErrorTest_ValidateProto3Extension_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  FileDescriptor *pFVar2;
  Arena *arena;
  char *in_R9;
  char *expected_predicate_value;
  Metadata MVar3;
  string_view value;
  string_view value_00;
  string_view file_text;
  FileDescriptorProto file_proto;
  DescriptorPool pool;
  string local_1f0;
  undefined1 local_1d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  AssertHelper local_1b0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1a8;
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a0;
  undefined1 local_188 [200];
  ArenaStringPtr local_c0 [2];
  ArenaStringPtr local_b0 [4];
  DescriptorPool local_90;
  
  DescriptorPool::DescriptorPool(&local_90);
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_188,(Arena *)0x0);
  MVar3 = FileDescriptorProto::GetMetadata
                    ((FileDescriptorProto *)_FileDescriptorProto_default_instance_);
  FileDescriptor::CopyTo((MVar3.descriptor)->file_,(FileDescriptorProto *)local_188);
  pFVar2 = DescriptorPool::BuildFile(&local_90,(FileDescriptorProto *)local_188);
  local_1d0[0] = pFVar2 != (FileDescriptor *)0x0;
  local_1c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (pFVar2 == (FileDescriptor *)0x0) {
    testing::Message::Message((Message *)&local_1a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1f0,(internal *)local_1d0,
               (AssertionResult *)"pool.BuildFile(file_proto) != nullptr","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x1ee2,local_1f0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
LAB_005b268d:
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    FileDescriptorProto::Clear((FileDescriptorProto *)local_188);
    local_188[0x10] = local_188[0x10] | 1;
    arena = (Arena *)local_188._8_8_;
    if ((local_188._8_8_ & 1) != 0) {
      arena = *(Arena **)(local_188._8_8_ & 0xfffffffffffffffe);
    }
    value._M_str = "foo.proto";
    value._M_len = 9;
    protobuf::internal::ArenaStringPtr::Set(local_c0,value,arena);
    local_188[0x10] = local_188[0x10] | 4;
    if ((local_188._8_8_ & 1) != 0) {
      local_188._8_8_ = *(undefined8 *)(local_188._8_8_ & 0xfffffffffffffffe);
    }
    value_00._M_str = "proto3";
    value_00._M_len = 6;
    protobuf::internal::ArenaStringPtr::Set(local_b0,value_00,(Arena *)local_188._8_8_);
    protobuf::internal::AddToRepeatedPtrField<char_const(&)[33]>
              ((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(local_188 + 0x18),(char (*) [33])0x1198291);
    paVar1 = &local_1f0.field_2;
    local_1f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1f0,"google.protobuf.FileOptions","");
    local_1d0 = (undefined1  [8])&local_1c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"test_file_opt","");
    AddExtension((FileDescriptorProto *)local_188,&local_1f0,(string *)local_1d0,0x3e9,
                 FieldDescriptorProto_Label_LABEL_OPTIONAL,FieldDescriptorProto_Type_TYPE_STRING);
    if (local_1d0 != (undefined1  [8])&local_1c0) {
      operator_delete((void *)local_1d0,local_1c0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    local_1f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1f0,"google.protobuf.MessageOptions","");
    local_1d0 = (undefined1  [8])&local_1c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"test_msg_opt","");
    AddExtension((FileDescriptorProto *)local_188,&local_1f0,(string *)local_1d0,0x3e9,
                 FieldDescriptorProto_Label_LABEL_OPTIONAL,FieldDescriptorProto_Type_TYPE_STRING);
    if (local_1d0 != (undefined1  [8])&local_1c0) {
      operator_delete((void *)local_1d0,local_1c0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    local_1f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1f0,"google.protobuf.FieldOptions","");
    local_1d0 = (undefined1  [8])&local_1c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"test_field_opt","");
    AddExtension((FileDescriptorProto *)local_188,&local_1f0,(string *)local_1d0,0x3eb,
                 FieldDescriptorProto_Label_LABEL_OPTIONAL,FieldDescriptorProto_Type_TYPE_STRING);
    if (local_1d0 != (undefined1  [8])&local_1c0) {
      operator_delete((void *)local_1d0,local_1c0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    local_1f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1f0,"google.protobuf.EnumOptions","");
    local_1d0 = (undefined1  [8])&local_1c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"test_enum_opt","");
    AddExtension((FileDescriptorProto *)local_188,&local_1f0,(string *)local_1d0,0x3ec,
                 FieldDescriptorProto_Label_LABEL_REPEATED,FieldDescriptorProto_Type_TYPE_INT32);
    if (local_1d0 != (undefined1  [8])&local_1c0) {
      operator_delete((void *)local_1d0,local_1c0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    local_1f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1f0,"google.protobuf.EnumValueOptions","");
    local_1d0 = (undefined1  [8])&local_1c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"test_enumval_opt","");
    AddExtension((FileDescriptorProto *)local_188,&local_1f0,(string *)local_1d0,0x3ed,
                 FieldDescriptorProto_Label_LABEL_OPTIONAL,FieldDescriptorProto_Type_TYPE_INT32);
    if (local_1d0 != (undefined1  [8])&local_1c0) {
      operator_delete((void *)local_1d0,local_1c0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    local_1f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1f0,"google.protobuf.ServiceOptions","");
    local_1d0 = (undefined1  [8])&local_1c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"test_svc_opt","");
    AddExtension((FileDescriptorProto *)local_188,&local_1f0,(string *)local_1d0,0x3ee,
                 FieldDescriptorProto_Label_LABEL_REPEATED,FieldDescriptorProto_Type_TYPE_INT32);
    if (local_1d0 != (undefined1  [8])&local_1c0) {
      operator_delete((void *)local_1d0,local_1c0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    local_1f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1f0,"google.protobuf.MethodOptions","");
    local_1d0 = (undefined1  [8])&local_1c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"test_method_opt","");
    AddExtension((FileDescriptorProto *)local_188,&local_1f0,(string *)local_1d0,0x3ef,
                 FieldDescriptorProto_Label_LABEL_OPTIONAL,FieldDescriptorProto_Type_TYPE_STRING);
    if (local_1d0 != (undefined1  [8])&local_1c0) {
      operator_delete((void *)local_1d0,local_1c0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    local_1f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1f0,"google.protobuf.OneofOptions","");
    local_1d0 = (undefined1  [8])&local_1c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"test_oneof_opt","");
    AddExtension((FileDescriptorProto *)local_188,&local_1f0,(string *)local_1d0,0x3f0,
                 FieldDescriptorProto_Label_LABEL_OPTIONAL,FieldDescriptorProto_Type_TYPE_STRING);
    if (local_1d0 != (undefined1  [8])&local_1c0) {
      operator_delete((void *)local_1d0,local_1c0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    local_1f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1f0,"google.protobuf.ExtensionRangeOptions","");
    local_1d0 = (undefined1  [8])&local_1c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"test_ext_opt","");
    expected_predicate_value = &DAT_00000009;
    AddExtension((FileDescriptorProto *)local_188,&local_1f0,(string *)local_1d0,0x3f1,
                 FieldDescriptorProto_Label_LABEL_OPTIONAL,FieldDescriptorProto_Type_TYPE_STRING);
    if (local_1d0 != (undefined1  [8])&local_1c0) {
      operator_delete((void *)local_1d0,local_1c0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    pFVar2 = DescriptorPool::BuildFile(&local_90,(FileDescriptorProto *)local_188);
    local_1d0[0] = pFVar2 != (FileDescriptor *)0x0;
    local_1c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (pFVar2 != (FileDescriptor *)0x0) {
      file_text._M_str =
           "name: \'google.protobuf.proto\' syntax: \'proto2\' message_type {   name: \'Container\' extension_range { start: 1 end: 1000 } }"
      ;
      file_text._M_len = 0x7a;
      ValidationErrorTest::BuildFile(&this->super_ValidationErrorTest,file_text);
      local_1f0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1f0,
                 "name: \'bar.proto\' syntax: \'proto3\' dependency: \'google.protobuf.proto\' extension {   name: \'bar\' number: 1 label: LABEL_OPTIONAL type: TYPE_INT32   extendee: \'Container\' }"
                 ,"");
      testing::
      Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      Matcher((Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_1a0,
              "bar.proto: bar: EXTENDEE: Extensions in proto3 are only allowed for defining options.\n"
             );
      ValidationErrorTest::BuildFileWithErrors
                (&this->super_ValidationErrorTest,&local_1f0,
                 (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1a0);
      testing::internal::
      MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~MatcherBase(&local_1a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      goto LAB_005b26bc;
    }
    testing::Message::Message((Message *)&local_1a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1f0,(internal *)local_1d0,
               (AssertionResult *)"pool.BuildFile(file_proto) != nullptr","false","true",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x1f1f,local_1f0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != paVar1) goto LAB_005b268d;
  }
  if (local_1a8._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_1a8._M_head_impl + 8))();
  }
  if (local_1c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c8,local_1c8);
  }
LAB_005b26bc:
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_188);
  DescriptorPool::~DescriptorPool(&local_90);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, ValidateProto3Extension) {
  // Valid for options.
  DescriptorPool pool;
  FileDescriptorProto file_proto;
  // Add "google/protobuf/descriptor.proto".
  FileDescriptorProto::descriptor()->file()->CopyTo(&file_proto);
  ASSERT_TRUE(pool.BuildFile(file_proto) != nullptr);
  // Add "foo.proto":
  //   import "google/protobuf/descriptor.proto";
  //   extend google.protobuf.FileOptions {
  //     optional string test_file_opt = 1001;
  //   }
  //   extend google.protobuf.MessageOptions {
  //     optional string test_msg_opt = 1002;
  //   }
  //   extend google.protobuf.FieldOptions {
  //     optional string test_field_opt = 1003;
  //   }
  //   extend google.protobuf.EnumOptions {
  //     repeated int32 test_enum_opt = 1004;
  //   }
  //   extend google.protobuf.EnumValueOptions {
  //     optional int32 test_enumval_opt = 1005;
  //   }
  //   extend google.protobuf.ServiceOptions {
  //     repeated int32 test_svc_opt = 1006;
  //   }
  //   extend google.protobuf.MethodOptions {
  //     optional string test_method_opt = 1007;
  //   }
  //   extend google.protobuf.OneofOptions {
  //     optional string test_oneof_opt = 1008;
  //   }
  //   extend google.protobuf.ExtensionRangeOptions {
  //     optional string test_ext_opt = 1009;
  //   }
  file_proto.Clear();
  file_proto.set_name("foo.proto");
  file_proto.set_syntax("proto3");
  file_proto.add_dependency("google/protobuf/descriptor.proto");
  AddExtension(&file_proto, "google.protobuf.FileOptions", "test_file_opt", 1001,
               FieldDescriptorProto::LABEL_OPTIONAL,
               FieldDescriptorProto::TYPE_STRING);
  AddExtension(&file_proto, "google.protobuf.MessageOptions", "test_msg_opt", 1001,
               FieldDescriptorProto::LABEL_OPTIONAL,
               FieldDescriptorProto::TYPE_STRING);
  AddExtension(&file_proto, "google.protobuf.FieldOptions", "test_field_opt", 1003,
               FieldDescriptorProto::LABEL_OPTIONAL,
               FieldDescriptorProto::TYPE_STRING);
  AddExtension(&file_proto, "google.protobuf.EnumOptions", "test_enum_opt", 1004,
               FieldDescriptorProto::LABEL_REPEATED,
               FieldDescriptorProto::TYPE_INT32);
  AddExtension(&file_proto, "google.protobuf.EnumValueOptions", "test_enumval_opt", 1005,
               FieldDescriptorProto::LABEL_OPTIONAL,
               FieldDescriptorProto::TYPE_INT32);
  AddExtension(&file_proto, "google.protobuf.ServiceOptions", "test_svc_opt", 1006,
               FieldDescriptorProto::LABEL_REPEATED,
               FieldDescriptorProto::TYPE_INT32);
  AddExtension(&file_proto, "google.protobuf.MethodOptions", "test_method_opt", 1007,
               FieldDescriptorProto::LABEL_OPTIONAL,
               FieldDescriptorProto::TYPE_STRING);
  AddExtension(&file_proto, "google.protobuf.OneofOptions", "test_oneof_opt", 1008,
               FieldDescriptorProto::LABEL_OPTIONAL,
               FieldDescriptorProto::TYPE_STRING);
  AddExtension(&file_proto, "google.protobuf.ExtensionRangeOptions", "test_ext_opt",
               1009, FieldDescriptorProto::LABEL_OPTIONAL,
               FieldDescriptorProto::TYPE_STRING);
  ASSERT_TRUE(pool.BuildFile(file_proto) != nullptr);

  // Copy and change the package of the descriptor.proto
  BuildFile(
      "name: 'google.protobuf.proto' "
      "syntax: 'proto2' "
      "message_type { "
      "  name: 'Container' extension_range { start: 1 end: 1000 } "
      "}");
  BuildFileWithErrors(
      "name: 'bar.proto' "
      "syntax: 'proto3' "
      "dependency: 'google.protobuf.proto' "
      "extension { "
      "  name: 'bar' number: 1 label: LABEL_OPTIONAL type: TYPE_INT32 "
      "  extendee: 'Container' "
      "}",
      "bar.proto: bar: EXTENDEE: Extensions in proto3 are only allowed for "
      "defining options.\n");
}